

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall ON_Font::ON_Font(ON_Font *this)

{
  ON_Font *this_local;
  
  this->m_runtime_serial_number = 0;
  this->m_windows_logfont_weight = 400;
  this->m_point_size = 0.0;
  this->m_apple_font_weight_trait = 0.0;
  this->m_font_weight = Normal;
  this->m_font_style = Upright;
  this->m_font_stretch = Medium;
  this->m_font_bUnderlined = false;
  this->m_font_bStrikethrough = false;
  this->m_logfont_charset = '\x01';
  this->m_font_origin = Unset;
  this->m_font_type = Unset;
  ON_wString::ON_wString(&this->m_locale_name);
  ON_wString::ON_wString(&this->m_loc_postscript_name);
  ON_wString::ON_wString(&this->m_en_postscript_name);
  ON_wString::ON_wString(&this->m_loc_family_name);
  ON_wString::ON_wString(&this->m_en_family_name);
  ON_wString::ON_wString(&this->m_loc_face_name);
  ON_wString::ON_wString(&this->m_en_face_name);
  ON_wString::ON_wString(&this->m_loc_windows_logfont_name);
  ON_wString::ON_wString(&this->m_en_windows_logfont_name);
  this->m_simulated = '\0';
  this->m_reserved1 = '\0';
  ON_PANOSE1::ON_PANOSE1(&this->m_panose1);
  ON_SHA1_Hash::ON_SHA1_Hash(&this->m_font_characteristics_hash);
  this->m_apple_font_width_trait = -1.23432101234321e+308;
  this->m_outline_figure_type = Unset;
  this->m_quartet_member = Unset;
  this->m_reserved2 = 0;
  this->m_reserved3 = 0;
  this->m_reserved4 = 0.0;
  std::shared_ptr<ON_FontGlyphCache>::shared_ptr(&this->m_font_glyph_cache);
  this->m_free_type_face = (ON_FreeTypeFace *)0x0;
  this->m_managed_installed_font_and_bits = 0;
  return;
}

Assistant:

ON_Font::ON_Font()
{
  ////const size_t sz = sizeof(*this);
  ////const char* p0 = (const char*)this;
  ////const char* p1 = (const char*)(&this->m_outline_figure_type);
  ////const char* p2 = (const char*)(&this->m_quartet_member);
  ////const char* p3 = (const char*)(&this->m_reserved2);
  ////const char* p4 = (const char*)(this + 1);
  ////const size_t sz1 = (p1 - p0);
  ////const size_t sz2 = (p2 - p0);
  ////const size_t sz3 = (p3 - p0);
  ////const size_t sz4 = (p4 - p0);
  ////if (sz != sz4 || sz1 <= 0 && sz2 <= sz1 && sz3 <= sz4 || sz4 != sz)
  ////  ON_TextLog::Null.PrintNewLine();
  /*
    sz1	144	const unsigned __int64
    sz2	145	const unsigned __int64
    sz3	146	const unsigned __int64
    sz4	192	const unsigned __int64
    sz	192	const unsigned __int64
  */
}